

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Loop.H
# Opt level: O0

void amrex::
     LoopOnCpu<amrex::(anonymous_namespace)::countCells(amrex::Array4<amrex::EBCellFlag_const>const&,amrex::Box_const&)::__1>
               (Box *bx,anon_class_88_4_59dc350c *f)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  anon_class_88_4_59dc350c *in_RSI;
  int *in_RDI;
  int i;
  int j;
  int k;
  Dim3 hi;
  Dim3 lo;
  int local_104;
  int local_100;
  int local_fc;
  
  iVar1 = *in_RDI;
  iVar2 = in_RDI[1];
  iVar3 = in_RDI[3];
  iVar4 = in_RDI[4];
  iVar5 = in_RDI[5];
  for (local_fc = in_RDI[2]; local_100 = iVar2, local_fc <= iVar5; local_fc = local_fc + 1) {
    for (; local_104 = iVar1, local_100 <= iVar4; local_100 = local_100 + 1) {
      for (; local_104 <= iVar3; local_104 = local_104 + 1) {
        anon_unknown_26::countCells::anon_class_88_4_59dc350c::operator()
                  (in_RSI,local_104,local_100,local_fc);
      }
    }
  }
  return;
}

Assistant:

void LoopOnCpu (Box const& bx, F&& f) noexcept
{
    const auto lo = amrex::lbound(bx);
    const auto hi = amrex::ubound(bx);
    for (int k = lo.z; k <= hi.z; ++k) {
    for (int j = lo.y; j <= hi.y; ++j) {
    for (int i = lo.x; i <= hi.x; ++i) {
        f(i,j,k);
    }}}
}